

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::DynamicMapField::InsertOrLookupMapValue
          (DynamicMapField *this,MapKey *map_key,MapValueRef *val)

{
  FieldDescriptor *this_00;
  bool bVar1;
  int iVar2;
  CppType CVar3;
  undefined4 extraout_var;
  Descriptor *this_01;
  FieldDescriptor *this_02;
  undefined8 *puVar4;
  undefined1 *val_00;
  string *this_03;
  undefined4 *puVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  void *val_01;
  pointer pvVar7;
  Message *value_9;
  Message *message;
  int32 *value_8;
  string *value_7;
  bool *value_6;
  float *value_5;
  double *value_4;
  uint64 *value_3;
  uint32 *value_2;
  int64 *value_1;
  int32 *value;
  allocator local_91;
  string local_90;
  FieldDescriptor *local_70;
  FieldDescriptor *val_des;
  MapValueRef *map_val;
  undefined1 local_48 [8];
  iterator iter;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *map;
  MapValueRef *val_local;
  MapKey *map_key_local;
  DynamicMapField *this_local;
  
  iVar2 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x11])();
  iter.it_.bucket_index_ = CONCAT44(extraout_var,iVar2);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
            ((iterator *)local_48,
             (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)iter.it_.bucket_index_,
             map_key);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
            ((iterator *)&map_val,
             (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)iter.it_.bucket_index_)
  ;
  bVar1 = protobuf::operator==((iterator *)local_48,(iterator *)&map_val);
  if (bVar1) {
    val_des = (FieldDescriptor *)
              Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                        ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
                         iter.it_.bucket_index_,map_key);
    this_01 = Message::GetDescriptor(this->default_entry_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"value",&local_91);
    this_02 = Descriptor::FindFieldByName(this_01,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    this_00 = val_des;
    local_70 = this_02;
    CVar3 = FieldDescriptor::cpp_type(this_02);
    MapValueRef::SetType((MapValueRef *)this_00,CVar3);
    CVar3 = FieldDescriptor::cpp_type(local_70);
    switch(CVar3) {
    case CPPTYPE_INT32:
      puVar5 = (undefined4 *)operator_new(4);
      *puVar5 = 0;
      MapValueRef::SetValue((MapValueRef *)val_des,puVar5);
      break;
    case CPPTYPE_INT64:
      puVar4 = (undefined8 *)operator_new(8);
      *puVar4 = 0;
      MapValueRef::SetValue((MapValueRef *)val_des,puVar4);
      break;
    case CPPTYPE_UINT32:
      puVar5 = (undefined4 *)operator_new(4);
      *puVar5 = 0;
      MapValueRef::SetValue((MapValueRef *)val_des,puVar5);
      break;
    case CPPTYPE_UINT64:
      puVar4 = (undefined8 *)operator_new(8);
      *puVar4 = 0;
      MapValueRef::SetValue((MapValueRef *)val_des,puVar4);
      break;
    case CPPTYPE_DOUBLE:
      puVar4 = (undefined8 *)operator_new(8);
      *puVar4 = 0;
      MapValueRef::SetValue((MapValueRef *)val_des,puVar4);
      break;
    case CPPTYPE_FLOAT:
      puVar5 = (undefined4 *)operator_new(4);
      *puVar5 = 0;
      MapValueRef::SetValue((MapValueRef *)val_des,puVar5);
      break;
    case CPPTYPE_BOOL:
      val_00 = (undefined1 *)operator_new(1);
      *val_00 = 0;
      MapValueRef::SetValue((MapValueRef *)val_des,val_00);
      break;
    case CPPTYPE_ENUM:
      puVar5 = (undefined4 *)operator_new(4);
      *puVar5 = 0;
      MapValueRef::SetValue((MapValueRef *)val_des,puVar5);
      break;
    case CPPTYPE_STRING:
      this_03 = (string *)operator_new(0x20);
      std::__cxx11::string::string(this_03);
      MapValueRef::SetValue((MapValueRef *)val_des,this_03);
      break;
    case CPPTYPE_MESSAGE:
      iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x16])();
      plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xd8))
                                 ((long *)CONCAT44(extraout_var_00,iVar2),this->default_entry_,
                                  local_70,0);
      val_01 = (void *)(**(code **)(*plVar6 + 0x18))();
      MapValueRef::SetValue((MapValueRef *)val_des,val_01);
    }
    MapValueRef::CopyFrom(val,(MapValueRef *)val_des);
    this_local._7_1_ = true;
  }
  else {
    pvVar7 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                       ((iterator *)local_48);
    MapValueRef::CopyFrom(val,&pvVar7->second);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicMapField::InsertOrLookupMapValue(
    const MapKey& map_key, MapValueRef* val) {
  // Always use mutable map because users may change the map value by
  // MapValueRef.
  Map<MapKey, MapValueRef>* map = MutableMap();
  Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
  if (iter == map->end()) {
    // Insert
    MapValueRef& map_val = (*map)[map_key];
    const FieldDescriptor* val_des =
        default_entry_->GetDescriptor()->FindFieldByName("value");
    map_val.SetType(val_des->cpp_type());
    // Allocate memory for the inserted MapValueRef, and initialize to
    // default value.
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                              \
      case google::protobuf::FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
        TYPE * value = new TYPE();                              \
        map_val.SetValue(value);                                \
        break;                                                  \
      }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = default_entry_->GetReflection()->GetMessage(
            *default_entry_, val_des);
        Message* value = message.New();
        map_val.SetValue(value);
        break;
      }
    }
    val->CopyFrom(map_val);
    return true;
  }
  // map_key is already in the map. Make sure (*map)[map_key] is not called.
  // [] may reorder the map and iterators.
  val->CopyFrom(iter->second);
  return false;
}